

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void __thiscall
Diffusion::diffuse_Vsync
          (Diffusion *this,MultiFab *Vsync,Real dt,Real be_cn_theta,MultiFab *rho_half,int rho_flag,
          MultiFab **beta,int betaComp,bool update_fluxreg)

{
  NavierStokesBase *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  StateDescriptor *this_00;
  BCRec *pBVar5;
  int k;
  long lVar6;
  int n;
  int i;
  IntVect smallend;
  Box top_strip;
  Box result;
  int allthere;
  
  checkBeta(this,beta,&allthere);
  diffuse_tensor_Vsync(this,Vsync,dt,be_cn_theta,rho_half,rho_flag,beta,betaComp,update_fluxreg);
  pNVar1 = this->navier_stokes;
  uVar2 = *(undefined8 *)(pNVar1->super_AmrLevel).geom.domain.smallend.vect;
  uVar3 = *(undefined8 *)((pNVar1->super_AmrLevel).geom.domain.smallend.vect + 2);
  uVar4 = *(undefined8 *)((pNVar1->super_AmrLevel).geom.domain.bigend.vect + 2);
  result.bigend.vect[1] =
       (int)((ulong)*(undefined8 *)(pNVar1->super_AmrLevel).geom.domain.bigend.vect >> 0x20);
  result.bigend.vect[2] = (int)uVar4;
  result.btype.itype = (uint)((ulong)uVar4 >> 0x20);
  result.smallend.vect[2] = (int)uVar3;
  result.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  result.smallend.vect[0] = (int)uVar2;
  result.smallend.vect[1] = (int)((ulong)uVar2 >> 0x20);
  result.smallend.vect[2] = result.smallend.vect[2] + -1;
  result.bigend.vect[0] = result.bigend.vect[0] + 1;
  result.smallend.vect[1] = result.smallend.vect[1] + -1;
  result.smallend.vect[0] = result.smallend.vect[0] + -1;
  result.bigend.vect[1] = result.bigend.vect[1] + 1;
  result.bigend.vect[2] = result.bigend.vect[2] + 1;
  for (i = 0; i != 3; i = i + 1) {
    this_00 = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,0);
    pBVar5 = amrex::StateDescriptor::getBC(this_00,i);
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      if (pBVar5->bc[lVar6 + 3] == 3) {
        smallend.vect[2] = result.smallend.vect[2];
        smallend.vect[0] = result.smallend.vect[0];
        smallend.vect[1] = result.smallend.vect[1];
        smallend.vect[lVar6] = result.bigend.vect[lVar6];
        top_strip.smallend.vect[2] = smallend.vect[2];
        top_strip.smallend.vect[0] = smallend.vect[0];
        top_strip.smallend.vect[1] = smallend.vect[1];
        top_strip.bigend.vect[2] = result.bigend.vect[2];
        top_strip.bigend.vect[1] = result.bigend.vect[1];
        top_strip.bigend.vect[0] = result.bigend.vect[0];
        top_strip.btype.itype = 0;
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&Vsync->super_FabArray<amrex::FArrayBox>,0.0,&top_strip,i,1,1);
      }
      if (pBVar5->bc[lVar6] == 3) {
        smallend.vect[2] = result.bigend.vect[2];
        smallend.vect[1] = result.bigend.vect[1];
        smallend.vect[0] = result.bigend.vect[0];
        smallend.vect[lVar6] = result.smallend.vect[lVar6];
        top_strip.smallend.vect[2] = result.smallend.vect[2];
        top_strip.smallend.vect[0] = result.smallend.vect[0];
        top_strip.smallend.vect[1] = result.smallend.vect[1];
        top_strip.bigend.vect[2] = smallend.vect[2];
        top_strip.bigend.vect[0] = smallend.vect[0];
        top_strip.bigend.vect[1] = smallend.vect[1];
        top_strip.btype.itype = 0;
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&Vsync->super_FabArray<amrex::FArrayBox>,0.0,&top_strip,i,1,1);
      }
    }
  }
  return;
}

Assistant:

void
Diffusion::diffuse_Vsync (MultiFab&              Vsync,
                          Real                   dt,
                          Real                   be_cn_theta,
                          const MultiFab&        rho_half,
                          int                    rho_flag,
                          const MultiFab* const* beta,
                          int                    betaComp,
                          bool                   update_fluxreg)
{
    BL_ASSERT(rho_flag == 1|| rho_flag == 3);

    int allthere;
    checkBeta(beta, allthere);

#ifdef AMREX_DEBUG
    for (int d = 0; d < AMREX_SPACEDIM; ++d)
        BL_ASSERT(beta[d]->min(0,0) >= 0.0);
#endif

    diffuse_tensor_Vsync(Vsync,dt,be_cn_theta,rho_half,rho_flag,beta,betaComp,update_fluxreg);
    //
    // applyBC has put "incorrect" values in the ghost cells
    // outside external Dirichlet boundaries. Reset these to zero
    // so that syncproject and conservative interpolation works correctly.
    //
    Box domain = amrex::grow(navier_stokes->Geom().Domain(),1);

    for (int n = Xvel; n < Xvel+AMREX_SPACEDIM; n++)
    {
        const BCRec& velbc = navier_stokes->get_desc_lst()[State_Type].getBC(n);

        for (int k = 0; k < AMREX_SPACEDIM; k++)
        {
            if (velbc.hi(k) == EXT_DIR)
            {
                IntVect smallend = domain.smallEnd();
                smallend.setVal(k,domain.bigEnd(k));
                Box top_strip(smallend,domain.bigEnd(),IntVect::TheCellVector());
                Vsync.setVal(0,top_strip,n-Xvel,1,1);
            }
            if (velbc.lo(k) == EXT_DIR)
            {
                IntVect bigend = domain.bigEnd();
                bigend.setVal(k,domain.smallEnd(k));
                Box bottom_strip(domain.smallEnd(),bigend,IntVect::TheCellVector());
                Vsync.setVal(0,bottom_strip,n-Xvel,1,1);
            }
        }
    }
}